

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionFreeStr.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionFreeStr::write_cpp_code_seq
          (InstructionFreeStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter,
          string *repl_data,string *repl_buf)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  StreamSep *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  StreamSep local_78;
  
  bVar2 = CppEmitter::need_buf(cpp_emitter);
  if ((bVar2) && (bVar2 = CppEmitter::interruptible(cpp_emitter), bVar2)) {
    pbVar1 = (this->strs).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (val = (this->strs).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; val != pbVar1; val = val + 1) {
      StreamSepMaker::operator<<
                (&local_78,ss,(char (*) [39])"HPIPE_BUFF_T::skip( &HPIPE_DATA.__beg_");
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_78.stream,local_78.sep._M_dataplus._M_p,
                          local_78.sep._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(val->_M_dataplus)._M_p,val->_M_string_length);
      pSVar4 = StreamSep::operator<<(&local_78,(char (*) [24])"_buf, HPIPE_DATA.__beg_");
      pSVar4 = StreamSep::operator<<(pSVar4,val);
      pSVar4 = StreamSep::operator<<
                         (pSVar4,(char (*) [53])
                                 "_data, HPIPE_BUFF_T::size_between( HPIPE_DATA.__beg_");
      pSVar4 = StreamSep::operator<<(pSVar4,val);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [24])"_buf, HPIPE_DATA.__beg_");
      pSVar4 = StreamSep::operator<<(pSVar4,val);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [8])0x17f9d3);
      pSVar4 = StreamSep::operator<<(pSVar4,repl_buf);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [3])0x17f63d);
      pSVar4 = StreamSep::operator<<(pSVar4,repl_data);
      StreamSep::operator<<(pSVar4,(char (*) [6])" ) );");
      StreamSep::~StreamSep(&local_78);
    }
  }
  return;
}

Assistant:

void InstructionFreeStr::write_cpp_code_seq( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter, std::string repl_data, std::string repl_buf ) {
    if ( cpp_emitter->need_buf() && cpp_emitter->interruptible() )
        for( const std::string &var : strs )
            ss << "HPIPE_BUFF_T::skip( &HPIPE_DATA.__beg_" << var << "_buf, HPIPE_DATA.__beg_" << var << "_data, HPIPE_BUFF_T::size_between( HPIPE_DATA.__beg_" << var << "_buf, HPIPE_DATA.__beg_" << var << "_data, " << repl_buf << ", " << repl_data << " ) );";
}